

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

Clifford * operator%(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  uint uVar2;
  uint uVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  iterator __position;
  int iVar7;
  Blade in_RAX;
  pointer pBVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  pointer pBVar12;
  long lVar13;
  float fVar14;
  Blade local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = dim;
  uVar11 = (ulong)dim;
  local_38 = in_RAX;
  if (0 < (long)uVar11) {
    memset(Re,0,uVar11 * 4);
  }
  pBVar8 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pBVar8 != pBVar4) {
    pBVar5 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pBVar6 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    do {
      pfVar9 = Re;
      if (pBVar5 != pBVar6) {
        uVar2 = pBVar8->mBase;
        pBVar12 = pBVar5;
        do {
          fVar14 = pBVar8->mVal * pBVar12->mVal;
          if (1e-06 < ABS(fVar14)) {
            uVar3 = pBVar12->mBase;
            uVar10 = uVar3 & uVar2;
            if ((uVar10 != uVar2) && (uVar10 != 0 && uVar10 != uVar3)) {
              pfVar9[(int)(uVar3 ^ uVar2)] =
                   (float)signs[(int)uVar2][(int)uVar3] * fVar14 + pfVar9[(int)(uVar3 ^ uVar2)];
            }
          }
          pBVar12 = pBVar12 + 1;
        } while (pBVar12 != pBVar6);
      }
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar4);
  }
  if (0 < iVar7) {
    lVar13 = 0;
    pfVar9 = Re;
    do {
      fVar14 = pfVar9[lVar13];
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        Blade::Blade(&local_38,(int)lVar13,fVar14);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,__position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        uVar11 = (ulong)(uint)dim;
        pfVar9 = Re;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)uVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator%(Clifford A, Clifford B)
{
   Clifford R;
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;

    idx a=A.begin();
	while(a!=A.end())
	{
		idx b=B.begin();
		int am=a->mBase;
		while(b!=B.end())
		{
			int bm=b->mBase;
			int q=am&bm;
			float c=(a->mVal)*(b->mVal);
			if((c>Error2||c<(-Error2))&&((q!=am)&&(q!=bm)&&(q!=0)))
			{
				//int sig=sign2(am,bm);
				//Re[am^bm]+=sig*c;
				Re[am^bm]+=signs[am][bm]*c;
			}
			b++;
		}
		a++;
	}
	
   for(int i=0;i<dim;i++)
   {if(Re[i]!=0){R.push_back(Blade(i,Re[i]));}}
  
  //delete Re;
  return R;
}